

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSM::generate_state_transition
          (FSM *this,Enum *enum_def,EnumVar *current_state,EnumVar *next_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  reference __k;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  *__x;
  size_type sVar3;
  reference pvVar4;
  reference __in;
  type *__x_00;
  pair<kratos::Var_*,_kratos::FSMState_*> *ppVar5;
  element_type *peVar6;
  InternalException *this_00;
  StmtBlock *pSVar7;
  element_type *peVar8;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *pmVar9;
  size_type num;
  char (*format_str) [50];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aVar10;
  string_view format_str_00;
  format_args args;
  byte local_559;
  shared_ptr<kratos::Stmt> local_420;
  undefined1 local_410 [32];
  shared_ptr<kratos::Const> local_3f0;
  _Self local_3e0;
  shared_ptr<kratos::Const> local_3d8;
  _Self local_3c8;
  undefined1 local_3c0 [32];
  shared_ptr<kratos::Stmt> local_3a0;
  undefined1 local_390 [39];
  undefined1 local_369;
  string local_368;
  shared_ptr<kratos::Stmt> local_348;
  undefined1 local_338 [8];
  shared_ptr<kratos::FunctionCallStmt> func_stmt_2;
  undefined1 local_318 [8];
  shared_ptr<kratos::AssignStmt> stmt_3;
  FSMState *next_fsm_state_1;
  shared_ptr<kratos::Stmt> local_2f0;
  shared_ptr<kratos::Stmt> local_2e0;
  undefined1 local_2d0 [8];
  shared_ptr<kratos::FunctionCallStmt> func_stmt_1;
  shared_ptr<kratos::AssignStmt> stmt_2;
  undefined1 local_2a0 [8];
  shared_ptr<kratos::IfStmt> new_if;
  undefined1 local_280 [8];
  shared_ptr<kratos::FunctionCallStmt> func_stmt;
  undefined1 local_260 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  shared_ptr<kratos::IfStmt> local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_230;
  shared_ptr<kratos::Stmt> local_220;
  undefined1 local_210 [32];
  undefined1 local_1f0 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  type *next_fsm_state;
  type *cond;
  __normal_iterator<std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
  local_1c8;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  *__range2;
  optional<std::pair<kratos::Var_*,_kratos::FSMState_*>_> default_state;
  undefined1 local_190 [7];
  bool has_slide_through;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  transitions;
  shared_ptr<kratos::IfStmt> top_if;
  shared_ptr<kratos::IfStmt> if_;
  mapped_type *state_name;
  FSMState **state;
  iterator __end1;
  iterator __begin1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1;
  anon_class_8_1_8991fb9c add_debug_info_to_stmt;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  undefined1 local_100 [8];
  shared_ptr<kratos::SwitchStmt> case_state_comb;
  undefined1 local_e0 [24];
  shared_ptr<kratos::FunctionStmtBlock> func_def;
  shared_ptr<kratos::CombinationalStmtBlock> state_comb;
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *state_name_mapping_local;
  EnumVar *next_state_local;
  EnumVar *current_state_local;
  Enum *enum_def_local;
  FSM *this_local;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_80;
  basic_string_view<char> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  _Base_ptr local_40;
  string *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_30;
  element_type *local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_20;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  Generator::combinational
            ((Generator *)
             &func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<kratos::FunctionStmtBlock>::shared_ptr
            ((shared_ptr<kratos::FunctionStmtBlock> *)(local_e0 + 0x10),(nullptr_t)0x0);
  if ((this->moore_ & 1U) == 0) {
    get_func_def((FSM *)local_e0);
    std::shared_ptr<kratos::FunctionStmtBlock>::operator=
              ((shared_ptr<kratos::FunctionStmtBlock> *)(local_e0 + 0x10),
               (shared_ptr<kratos::FunctionStmtBlock> *)local_e0);
    std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::FunctionStmtBlock> *)local_e0);
  }
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_100);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &add_debug_info_to_stmt,this,false);
  __range1 = (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)this;
  __end1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin
                     ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                      &add_debug_info_to_stmt);
  state = (FSMState **)
          std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end
                    ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                     &add_debug_info_to_stmt);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                                *)&state);
    if (!bVar2) {
      pSVar7 = &std::
                __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&func_def.
                                 super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount)->super_StmtBlock;
      Var::assign((Var *)local_3c0,&next_state->super_Var,(AssignmentType)current_state);
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                ((shared_ptr<kratos::Stmt> *)(local_3c0 + 0x10),
                 (shared_ptr<kratos::AssignStmt> *)local_3c0);
      StmtBlock::add_stmt(pSVar7,(shared_ptr<kratos::Stmt> *)(local_3c0 + 0x10));
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3c0 + 0x10));
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3c0);
      peVar8 = std::
               __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_100);
      pmVar9 = SwitchStmt::body(peVar8);
      std::shared_ptr<kratos::Const>::shared_ptr(&local_3d8,(nullptr_t)0x0);
      local_3c8._M_node =
           (_Base_ptr)
           std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::find(pmVar9,&local_3d8);
      peVar8 = std::
               __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_100);
      pmVar9 = SwitchStmt::body(peVar8);
      local_3e0._M_node =
           (_Base_ptr)
           std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::end(pmVar9);
      bVar2 = std::operator==(&local_3c8,&local_3e0);
      local_559 = 0;
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_100);
        pmVar9 = SwitchStmt::body(peVar8);
        num = std::
              map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              ::size(pmVar9);
        bVar2 = is_2_power(num);
        local_559 = bVar2 ^ 0xff;
      }
      std::shared_ptr<kratos::Const>::~shared_ptr(&local_3d8);
      if ((local_559 & 1) != 0) {
        peVar8 = std::
                 __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_100);
        std::shared_ptr<kratos::Const>::shared_ptr(&local_3f0,(nullptr_t)0x0);
        Var::assign((Var *)local_410,&next_state->super_Var,(AssignmentType)current_state);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_410 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_410);
        SwitchStmt::add_switch_case
                  (peVar8,&local_3f0,(shared_ptr<kratos::Stmt> *)(local_410 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_410 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_410);
        std::shared_ptr<kratos::Const>::~shared_ptr(&local_3f0);
      }
      pSVar7 = &std::
                __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&func_def.
                                 super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount)->super_StmtBlock;
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SwitchStmt,void>
                (&local_420,(shared_ptr<kratos::SwitchStmt> *)local_100);
      StmtBlock::add_stmt(pSVar7,&local_420);
      std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_420);
      std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~vector
                ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                 &add_debug_info_to_stmt);
      std::shared_ptr<kratos::SwitchStmt>::~shared_ptr((shared_ptr<kratos::SwitchStmt> *)local_100);
      std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::FunctionStmtBlock> *)(local_e0 + 0x10));
      std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::CombinationalStmtBlock> *)
                 &func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    __k = __gnu_cxx::
          __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
          ::operator*(&__end1);
    std::
    unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(state_name_mapping,__k);
    std::shared_ptr<kratos::IfStmt>::shared_ptr
              ((shared_ptr<kratos::IfStmt> *)
               &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (nullptr_t)0x0);
    std::shared_ptr<kratos::IfStmt>::shared_ptr
              ((shared_ptr<kratos::IfStmt> *)
               &transitions.
                super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
    __x = FSMState::transitions(*__k);
    std::
    vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              *)local_190,__x);
    default_state.super__Optional_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::pair<kratos::Var_*,_kratos::FSMState_*>_>._23_1_ =
         0;
    sVar3 = std::
            vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
            ::size((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                    *)local_190);
    if (sVar3 == 1) {
      pvVar4 = std::
               vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
               ::operator[]((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                             *)local_190,0);
      if (pvVar4->first == (Var *)0x0) {
        default_state.super__Optional_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_true,_true>
        ._M_payload.super__Optional_payload_base<std::pair<kratos::Var_*,_kratos::FSMState_*>_>.
        _23_1_ = 1;
      }
    }
    std::optional<std::pair<kratos::Var_*,_kratos::FSMState_*>_>::optional
              ((optional<std::pair<kratos::Var_*,_kratos::FSMState_*>_> *)&__range2);
    __end2 = std::
             vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
             ::begin((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                      *)local_190);
    local_1c8._M_current =
         (pair<kratos::Var_*,_kratos::FSMState_*> *)
         std::
         vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
         ::end((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                *)local_190);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&local_1c8);
      if (!bVar2) break;
      __in = __gnu_cxx::
             __normal_iterator<std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
             ::operator*(&__end2);
      __x_00 = std::get<0ul,kratos::Var*,kratos::FSMState*>(__in);
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::get<1ul,kratos::Var*,kratos::FSMState*>(__in);
      if (*__x_00 == (type)0x0) {
        sVar3 = std::
                vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                ::size((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                        *)local_190);
        if (sVar3 == 1) {
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base;
          get_next_state_stmt((FSM *)local_1f0,(Enum *)this,(EnumVar *)enum_def,
                              (FSMState *)next_state,*__k,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_R9.values_);
          peVar8 = std::
                   __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_100);
          Enum::get_enum((Enum *)local_210,(string *)enum_def);
          std::shared_ptr<kratos::Const>::shared_ptr<kratos::EnumConst,void>
                    ((shared_ptr<kratos::Const> *)(local_210 + 0x10),
                     (shared_ptr<kratos::EnumConst> *)local_210);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    (&local_220,(shared_ptr<kratos::AssignStmt> *)local_1f0);
          SwitchStmt::add_switch_case
                    (peVar8,(shared_ptr<kratos::Const> *)(local_210 + 0x10),&local_220);
          std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_220);
          std::shared_ptr<kratos::Const>::~shared_ptr
                    ((shared_ptr<kratos::Const> *)(local_210 + 0x10));
          std::shared_ptr<kratos::EnumConst>::~shared_ptr
                    ((shared_ptr<kratos::EnumConst> *)local_210);
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)local_1f0);
          break;
        }
      }
      if (*__x_00 == (type)0x0) {
        aVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                  )std::make_pair<kratos::Var*const&,kratos::FSMState*const&>
                             (__x_00,(FSMState **)
                                     stmt.
                                     super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
        local_230 = aVar10;
        std::optional<std::pair<kratos::Var*,kratos::FSMState*>>::operator=
                  ((optional<std::pair<kratos::Var*,kratos::FSMState*>> *)&__range2,
                   (pair<kratos::Var_*,_kratos::FSMState_*> *)&local_230);
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar2) {
          std::enable_shared_from_this<kratos::Var>::shared_from_this
                    ((enable_shared_from_this<kratos::Var> *)
                     &stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>>
                    ((shared_ptr<kratos::Var> *)local_2a0);
          std::shared_ptr<kratos::Var>::~shared_ptr
                    ((shared_ptr<kratos::Var> *)
                     &stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base;
          get_next_state_stmt((FSM *)&func_stmt_1.
                                      super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(Enum *)this,(EnumVar *)enum_def,
                              (FSMState *)next_state,*__k,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_R9.values_);
          std::shared_ptr<kratos::FunctionCallStmt>::shared_ptr
                    ((shared_ptr<kratos::FunctionCallStmt> *)local_2d0,(nullptr_t)0x0);
          peVar6 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2a0);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    (&local_2e0,
                     (shared_ptr<kratos::AssignStmt> *)
                     &func_stmt_1.
                      super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          IfStmt::add_then_stmt(peVar6,&local_2e0);
          std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_2e0);
          if ((this->moore_ & 1U) == 0) {
            get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)(local_e0 + 0x10),
                               (FSMState *)
                               (stmt.
                                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base,
                               (shared_ptr<kratos::FunctionCallStmt> *)local_2d0);
            peVar6 = std::
                     __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2a0);
            std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FunctionCallStmt,void>
                      (&local_2f0,(shared_ptr<kratos::FunctionCallStmt> *)local_2d0);
            IfStmt::add_then_stmt(peVar6,&local_2f0);
            std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_2f0);
          }
          generate_state_transition::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&__range1,
                     (shared_ptr<kratos::FunctionCallStmt> *)local_2d0,*__k);
          peVar6 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&top_if.
                                  super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                    ((shared_ptr<kratos::Stmt> *)&next_fsm_state_1,
                     (shared_ptr<kratos::IfStmt> *)local_2a0);
          IfStmt::add_else_stmt(peVar6,(shared_ptr<kratos::Stmt> *)&next_fsm_state_1);
          std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&next_fsm_state_1);
          std::shared_ptr<kratos::IfStmt>::operator=
                    ((shared_ptr<kratos::IfStmt> *)
                     &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<kratos::IfStmt> *)local_2a0);
          std::shared_ptr<kratos::FunctionCallStmt>::~shared_ptr
                    ((shared_ptr<kratos::FunctionCallStmt> *)local_2d0);
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)
                     &func_stmt_1.
                      super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_2a0);
        }
        else {
          std::enable_shared_from_this<kratos::Var>::shared_from_this
                    ((enable_shared_from_this<kratos::Var> *)
                     &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>>
                    ((shared_ptr<kratos::Var> *)&local_240);
          std::shared_ptr<kratos::IfStmt>::operator=
                    ((shared_ptr<kratos::IfStmt> *)
                     &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&local_240);
          std::shared_ptr<kratos::IfStmt>::~shared_ptr(&local_240);
          std::shared_ptr<kratos::Var>::~shared_ptr
                    ((shared_ptr<kratos::Var> *)
                     &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base;
          get_next_state_stmt((FSM *)local_260,(Enum *)this,(EnumVar *)enum_def,
                              (FSMState *)next_state,*__k,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_R9.values_);
          peVar6 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&top_if.
                                  super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          p_Var1 = &func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    ((shared_ptr<kratos::Stmt> *)p_Var1,(shared_ptr<kratos::AssignStmt> *)local_260)
          ;
          IfStmt::add_then_stmt(peVar6,(shared_ptr<kratos::Stmt> *)p_Var1);
          std::shared_ptr<kratos::Stmt>::~shared_ptr
                    ((shared_ptr<kratos::Stmt> *)
                     &func_stmt.
                      super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<kratos::FunctionCallStmt>::shared_ptr
                    ((shared_ptr<kratos::FunctionCallStmt> *)local_280,(nullptr_t)0x0);
          if ((this->moore_ & 1U) == 0) {
            get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)(local_e0 + 0x10),
                               (FSMState *)
                               (stmt.
                                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base,
                               (shared_ptr<kratos::FunctionCallStmt> *)local_280);
            peVar6 = std::
                     __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&top_if.
                                    super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
            p_Var1 = &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FunctionCallStmt,void>
                      ((shared_ptr<kratos::Stmt> *)p_Var1,
                       (shared_ptr<kratos::FunctionCallStmt> *)local_280);
            IfStmt::add_then_stmt(peVar6,(shared_ptr<kratos::Stmt> *)p_Var1);
            std::shared_ptr<kratos::Stmt>::~shared_ptr
                      ((shared_ptr<kratos::Stmt> *)
                       &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::shared_ptr<kratos::IfStmt>::operator=
                    ((shared_ptr<kratos::IfStmt> *)
                     &transitions.
                      super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (shared_ptr<kratos::IfStmt> *)
                     &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          generate_state_transition::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&__range1,
                     (shared_ptr<kratos::FunctionCallStmt> *)local_280,*__k);
          std::shared_ptr<kratos::FunctionCallStmt>::~shared_ptr
                    ((shared_ptr<kratos::FunctionCallStmt> *)local_280);
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)local_260);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::pair<kratos::Var_*,_kratos::FSMState_*>_*,_std::vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = std::optional::operator_cast_to_bool((optional *)&__range2);
    if (bVar2) {
      ppVar5 = std::optional<std::pair<kratos::Var_*,_kratos::FSMState_*>_>::operator->
                         ((optional<std::pair<kratos::Var_*,_kratos::FSMState_*>_> *)&__range2);
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
               )ppVar5->second;
      stmt_3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_R9;
      get_next_state_stmt((FSM *)local_318,(Enum *)this,(EnumVar *)enum_def,(FSMState *)next_state,
                          *__k,(unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_R9.values_);
      peVar6 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      p_Var1 = &func_stmt_2.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                ((shared_ptr<kratos::Stmt> *)p_Var1,(shared_ptr<kratos::AssignStmt> *)local_318);
      IfStmt::add_else_stmt(peVar6,(shared_ptr<kratos::Stmt> *)p_Var1);
      std::shared_ptr<kratos::Stmt>::~shared_ptr
                ((shared_ptr<kratos::Stmt> *)
                 &func_stmt_2.
                  super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<kratos::FunctionCallStmt>::shared_ptr
                ((shared_ptr<kratos::FunctionCallStmt> *)local_338,(nullptr_t)0x0);
      if ((this->moore_ & 1U) == 0) {
        get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)(local_e0 + 0x10),
                           (FSMState *)
                           stmt_3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,(shared_ptr<kratos::FunctionCallStmt> *)local_338);
        peVar6 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&top_if.
                                  super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FunctionCallStmt,void>
                  (&local_348,(shared_ptr<kratos::FunctionCallStmt> *)local_338);
        IfStmt::add_then_stmt(peVar6,&local_348);
        std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_348);
      }
      generate_state_transition::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&__range1,
                 (shared_ptr<kratos::FunctionCallStmt> *)local_338,*__k);
      std::shared_ptr<kratos::FunctionCallStmt>::~shared_ptr
                ((shared_ptr<kratos::FunctionCallStmt> *)local_338);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_318);
    }
    if ((default_state.
         super__Optional_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<kratos::Var_*,_kratos::FSMState_*>_>._23_1_ & 1) ==
        0) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &transitions.
                          super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) {
        local_369 = 1;
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)FSMState::name_abi_cxx11_(*__k);
        local_38 = &local_368;
        local_40 = (_Base_ptr)0x423ff7;
        local_68._M_allocated_capacity =
             (size_type)
             fmt::v7::make_args_checked<std::__cxx11::string_const&,char[50],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)"Unable to find any state transition for state {0}",(v7 *)vargs,
                        format_str,
                        (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                        "Unable to find any state transition for state {0}");
        local_50 = &local_68;
        local_78 = fmt::v7::to_string_view<char,_0>((char *)local_40);
        local_28 = (element_type *)&this_local;
        local_30 = local_50;
        local_20 = local_50;
        local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
        local_18 = local_28;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_28,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_50);
        format_str_00.size_ = (size_t)this_local;
        format_str_00.data_ = (char *)local_78.size_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_80._M_pi;
        fmt::v7::detail::vformat_abi_cxx11_(&local_368,(detail *)local_78.data_,format_str_00,args);
        InternalException::InternalException(this_00,&local_368);
        local_369 = 0;
        __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
      }
      peVar8 = std::
               __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_100);
      Enum::get_enum((Enum *)local_390,(string *)enum_def);
      std::shared_ptr<kratos::Const>::shared_ptr<kratos::EnumConst,void>
                ((shared_ptr<kratos::Const> *)(local_390 + 0x10),
                 (shared_ptr<kratos::EnumConst> *)local_390);
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                (&local_3a0,
                 (shared_ptr<kratos::IfStmt> *)
                 &transitions.
                  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      SwitchStmt::add_switch_case(peVar8,(shared_ptr<kratos::Const> *)(local_390 + 0x10),&local_3a0)
      ;
      std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_3a0);
      std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)(local_390 + 0x10));
      std::shared_ptr<kratos::EnumConst>::~shared_ptr((shared_ptr<kratos::EnumConst> *)local_390);
    }
    std::
    vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::~vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
               *)local_190);
    std::shared_ptr<kratos::IfStmt>::~shared_ptr
              ((shared_ptr<kratos::IfStmt> *)
               &transitions.
                super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<kratos::IfStmt>::~shared_ptr
              ((shared_ptr<kratos::IfStmt> *)
               &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void FSM::generate_state_transition(
    Enum& enum_def, EnumVar& current_state, EnumVar& next_state,
    const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto state_comb = generator_->combinational();

    std::shared_ptr<FunctionStmtBlock> func_def = nullptr;
    if (!moore_) func_def = get_func_def();
    auto case_state_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    auto add_debug_info_to_stmt = [this](std::shared_ptr<FunctionCallStmt>& func_stmt,
                                         const FSMState* state) {
        if (generator_->debug) {
            if (func_stmt) {
                add_debug_info(state, func_stmt);
                func_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
        }
    };
    for (auto const& state : states) {
        auto const& state_name = state_name_mapping.at(state);
        // a list of if statements
        std::shared_ptr<IfStmt> if_ = nullptr;
        std::shared_ptr<IfStmt> top_if = nullptr;
        auto transitions = state->transitions();
        // slide through condition
        bool has_slide_through = false;
        if (transitions.size() == 1 && transitions[0].first == nullptr) {
            has_slide_through = true;
        }
        std::optional<std::pair<Var *, FSMState *>> default_state;
        for (auto const& [cond, next_fsm_state] : transitions) {
            if (!cond && (transitions.size() == 1)) {
                // direct transition
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                case_state_comb->add_switch_case(enum_def.get_enum(state_name), stmt);
                break;
            } else if (!cond) {
                // we have a default case here
                default_state= std::make_pair(cond, next_fsm_state);
                continue;
            }

            if (!if_) {
                if_ = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                if_->add_then_stmt(stmt);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    if_->add_then_stmt(func_stmt);
                }
                top_if = if_;
                add_debug_info_to_stmt(func_stmt, state);
            } else {
                auto new_if = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                new_if->add_then_stmt(stmt);
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    new_if->add_then_stmt(func_stmt);
                }
                add_debug_info_to_stmt(func_stmt, state);
                if_->add_else_stmt(new_if);
                if_ = new_if;
            }
        }

        if (default_state) {
            auto* next_fsm_state = default_state->second;
            auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                            state_name_mapping);
            if_->add_else_stmt(stmt);
            // mealy machine need to add extra state transition outputs
            std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
            if (!moore_) {
                get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                if_->add_then_stmt(func_stmt);
            }
            add_debug_info_to_stmt(func_stmt, state);
        }

        if (!has_slide_through) {
            if (!top_if)
                throw InternalException(
                    ::format("Unable to find any state transition for state {0}", state->name()));
            case_state_comb->add_switch_case(enum_def.get_enum(state_name), top_if);
        }
    }

    // prevent latch generation
    state_comb->add_stmt(next_state.assign(current_state, AssignmentType::Blocking));

    // also default case
    if (case_state_comb->body().find(nullptr) == case_state_comb->body().end() &&
        !is_2_power(case_state_comb->body().size())) {
        case_state_comb->add_switch_case(
            nullptr, next_state.assign(current_state, AssignmentType::Blocking));
    }

    // add it to the state_comb
    state_comb->add_stmt(case_state_comb);
}